

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrypt.cc
# Opt level: O3

void scryptBlockMix(block_t *out,block_t *B,uint64_t r)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  uint64_t uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  block_t X;
  uint local_12c;
  uint local_128 [16];
  ulong local_e8;
  ulong local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  uint64_t local_98;
  ulong local_90;
  block_t *local_88;
  
  if (out != B) {
    local_a8 = *(undefined8 *)(B[r * 2 + -1].words + 0xc);
    uStack_a0 = *(undefined8 *)(B[r * 2 + -1].words + 0xc + 2);
    local_b8 = *(undefined8 *)(B[r * 2 + -1].words + 8);
    uStack_b0 = *(undefined8 *)(B[r * 2 + -1].words + 8 + 2);
    local_c8 = *(undefined8 *)(B[r * 2 + -1].words + 4);
    uStack_c0 = *(undefined8 *)(B[r * 2 + -1].words + 4 + 2);
    local_d8 = *(undefined8 *)B[r * 2 + -1].words;
    uStack_d0 = *(ulong *)(B[r * 2 + -1].words + 2);
    local_90 = r * 2;
    if (r * 2 != 0) {
      uVar10 = 0;
      local_98 = r;
      do {
        lVar8 = 0;
        do {
          uVar3 = *(ulong *)(B->words + lVar8 + 2);
          *(ulong *)((long)&local_d8 + lVar8 * 4) =
               *(ulong *)(B->words + lVar8) ^ *(ulong *)((long)&local_d8 + lVar8 * 4);
          *(ulong *)((long)&uStack_d0 + lVar8 * 4) =
               uVar3 ^ *(ulong *)((long)&uStack_d0 + lVar8 * 4);
          lVar8 = lVar8 + 4;
        } while (lVar8 != 0x10);
        local_128[0] = (uint)local_d8;
        local_128[1] = (uint)((ulong)local_d8 >> 0x20);
        local_128[0xc] = (uint)local_a8;
        local_128[0xd] = (uint)((ulong)local_a8 >> 0x20);
        local_128[4] = (uint)local_c8;
        local_128[5] = (uint)((ulong)local_c8 >> 0x20);
        local_128[8] = (uint)local_b8;
        local_128[9] = (uint)((ulong)local_b8 >> 0x20);
        local_128[10] = (uint)uStack_b0;
        local_128[6] = (uint)uStack_c0;
        local_128[0xe] = (uint)uStack_a0;
        local_e0 = uStack_d0 & 0xffffffff;
        local_128[0xf] = (uint)((ulong)uStack_a0 >> 0x20);
        local_128[0xb] = (uint)((ulong)uStack_b0 >> 0x20);
        local_e8 = uStack_d0 >> 0x20;
        local_12c = 10;
        local_128[7] = (uint)((ulong)uStack_c0 >> 0x20);
        do {
          local_128[4] = ((local_128[0xc] + local_128[0]) * 0x80 |
                         local_128[0xc] + local_128[0] >> 0x19) ^ local_128[4];
          local_128[8] = ((local_128[4] + local_128[0]) * 0x200 |
                         local_128[4] + local_128[0] >> 0x17) ^ local_128[8];
          local_128[0xc] =
               ((local_128[8] + local_128[4]) * 0x2000 | local_128[8] + local_128[4] >> 0x13) ^
               local_128[0xc];
          uVar12 = local_128[0xc] + local_128[8];
          local_128[9] = ((local_128[1] + local_128[5]) * 0x80 | local_128[1] + local_128[5] >> 0x19
                         ) ^ local_128[9];
          local_128[0xd] =
               ((local_128[9] + local_128[5]) * 0x200 | local_128[9] + local_128[5] >> 0x17) ^
               local_128[0xd];
          local_128[1] = ((local_128[0xd] + local_128[9]) * 0x2000 |
                         local_128[0xd] + local_128[9] >> 0x13) ^ local_128[1];
          uVar11 = local_128[1] + local_128[0xd];
          local_128[0] = (uVar12 * 0x40000 | uVar12 >> 0xe) ^ local_128[0];
          local_128[0xe] =
               ((local_128[6] + local_128[10]) * 0x80 | local_128[6] + local_128[10] >> 0x19) ^
               local_128[0xe];
          local_e0._0_4_ =
               ((local_128[0xe] + local_128[10]) * 0x200 | local_128[0xe] + local_128[10] >> 0x17) ^
               (uint)local_e0;
          local_128[6] = ((local_128[0xe] + (uint)local_e0) * 0x2000 |
                         local_128[0xe] + (uint)local_e0 >> 0x13) ^ local_128[6];
          uVar12 = local_128[6] + (uint)local_e0;
          local_128[5] = (uVar11 * 0x40000 | uVar11 >> 0xe) ^ local_128[5];
          local_e8._0_4_ =
               ((local_128[0xb] + local_128[0xf]) * 0x80 | local_128[0xb] + local_128[0xf] >> 0x19)
               ^ (uint)local_e8;
          local_128[7] = (((uint)local_e8 + local_128[0xf]) * 0x200 |
                         (uint)local_e8 + local_128[0xf] >> 0x17) ^ local_128[7];
          local_128[0xb] =
               ((local_128[7] + (uint)local_e8) * 0x2000 | local_128[7] + (uint)local_e8 >> 0x13) ^
               local_128[0xb];
          uVar11 = local_128[0xb] + local_128[7];
          local_128[10] = (uVar12 * 0x40000 | uVar12 >> 0xe) ^ local_128[10];
          local_128[1] = (((uint)local_e8 + local_128[0]) * 0x80 |
                         (uint)local_e8 + local_128[0] >> 0x19) ^ local_128[1];
          local_128[2] = ((local_128[1] + local_128[0]) * 0x200 |
                         local_128[1] + local_128[0] >> 0x17) ^ (uint)local_e0;
          local_128[3] = ((local_128[2] + local_128[1]) * 0x2000 |
                         local_128[2] + local_128[1] >> 0x13) ^ (uint)local_e8;
          local_e8 = (ulong)local_128[3];
          local_e0 = (ulong)local_128[2];
          local_128[0xf] = (uVar11 * 0x40000 | uVar11 >> 0xe) ^ local_128[0xf];
          local_128[6] = ((local_128[5] + local_128[4]) * 0x80 | local_128[5] + local_128[4] >> 0x19
                         ) ^ local_128[6];
          local_128[7] = ((local_128[6] + local_128[5]) * 0x200 |
                         local_128[6] + local_128[5] >> 0x17) ^ local_128[7];
          local_128[4] = ((local_128[7] + local_128[6]) * 0x2000 |
                         local_128[7] + local_128[6] >> 0x13) ^ local_128[4];
          local_128[0] = ((local_128[3] + local_128[2]) * 0x40000 |
                         local_128[3] + local_128[2] >> 0xe) ^ local_128[0];
          local_128[0xb] =
               ((local_128[10] + local_128[9]) * 0x80 | local_128[10] + local_128[9] >> 0x19) ^
               local_128[0xb];
          local_128[8] = ((local_128[10] + local_128[0xb]) * 0x200 |
                         local_128[10] + local_128[0xb] >> 0x17) ^ local_128[8];
          local_128[9] = ((local_128[8] + local_128[0xb]) * 0x2000 |
                         local_128[8] + local_128[0xb] >> 0x13) ^ local_128[9];
          local_128[5] = ((local_128[4] + local_128[7]) * 0x40000 |
                         local_128[4] + local_128[7] >> 0xe) ^ local_128[5];
          local_128[0xc] =
               ((local_128[0xe] + local_128[0xf]) * 0x80 | local_128[0xe] + local_128[0xf] >> 0x19)
               ^ local_128[0xc];
          local_128[0xd] =
               ((local_128[0xc] + local_128[0xf]) * 0x200 | local_128[0xc] + local_128[0xf] >> 0x17)
               ^ local_128[0xd];
          local_128[0xe] =
               ((local_128[0xd] + local_128[0xc]) * 0x2000 | local_128[0xd] + local_128[0xc] >> 0x13
               ) ^ local_128[0xe];
          local_128[10] =
               ((local_128[9] + local_128[8]) * 0x40000 | local_128[9] + local_128[8] >> 0xe) ^
               local_128[10];
          local_128[0xf] =
               ((local_128[0xe] + local_128[0xd]) * 0x40000 | local_128[0xe] + local_128[0xd] >> 0xe
               ) ^ local_128[0xf];
          local_12c = local_12c - 2;
        } while (2 < local_12c);
        lVar8 = 0;
        do {
          uVar12 = local_128[lVar8 + 1];
          uVar11 = local_128[lVar8 + 2];
          uVar4 = local_128[lVar8 + 3];
          lVar1 = lVar8 * 4;
          iVar5 = *(int *)((long)&local_d8 + lVar1 + 4);
          iVar6 = *(int *)((long)&uStack_d0 + lVar1);
          iVar7 = *(int *)((long)&uStack_d0 + lVar1 + 4);
          lVar2 = lVar8 * 4;
          *(uint *)((long)&local_d8 + lVar2) = *(int *)((long)&local_d8 + lVar1) + local_128[lVar8];
          *(uint *)((long)&local_d8 + lVar2 + 4) = iVar5 + uVar12;
          *(uint *)((long)&uStack_d0 + lVar2) = iVar6 + uVar11;
          *(uint *)((long)&uStack_d0 + lVar2 + 4) = iVar7 + uVar4;
          lVar8 = lVar8 + 4;
        } while (lVar8 != 0x10);
        uVar9 = 0;
        if ((uVar10 & 1) != 0) {
          uVar9 = local_98;
        }
        uVar3 = uVar10 & 0x7fffffffffffffe;
        *(undefined8 *)(out[uVar9].words + uVar3 * 8 + 0xc) = local_a8;
        *(undefined8 *)(out[uVar9].words + uVar3 * 8 + 0xc + 2) = uStack_a0;
        *(undefined8 *)(out[uVar9].words + uVar3 * 8 + 8) = local_b8;
        *(undefined8 *)(out[uVar9].words + uVar3 * 8 + 8 + 2) = uStack_b0;
        *(undefined8 *)(out[uVar9].words + uVar3 * 8 + 4) = local_c8;
        *(undefined8 *)(out[uVar9].words + uVar3 * 8 + 4 + 2) = uStack_c0;
        *(undefined8 *)(out[uVar9].words + uVar3 * 8) = local_d8;
        *(ulong *)(out[uVar9].words + uVar3 * 8 + 2) = uStack_d0;
        uVar10 = uVar10 + 1;
        B = B + 1;
      } while (uVar10 != local_90);
    }
    return;
  }
  local_88 = out;
  __assert_fail("out != B",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/scrypt.cc"
                ,99,"void scryptBlockMix(block_t *, const block_t *, uint64_t)");
}

Assistant:

static void scryptBlockMix(block_t *out, const block_t *B, uint64_t r) {
  assert(out != B);

  block_t X;
  OPENSSL_memcpy(&X, &B[r * 2 - 1], sizeof(X));
  for (uint64_t i = 0; i < r * 2; i++) {
    xor_block(&X, &X, &B[i]);
    salsa208_word_specification(&X);

    // This implements the permutation in step 3.
    OPENSSL_memcpy(&out[i / 2 + (i & 1) * r], &X, sizeof(X));
  }
}